

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deThreadTest.c
# Opt level: O2

void consumerThread(void *arg)

{
  uint uVar1;
  int iVar2;
  
  iVar2 = 0;
  do {
    deSemaphore_decrement(*(deSemaphore *)((long)arg + 0x88));
    uVar1 = *(uint *)((long)arg + (long)iVar2 * 4);
    iVar2 = (iVar2 + 1) % 0x20;
    deSemaphore_increment(*(deSemaphore *)((long)arg + 0x80));
    *(uint *)((long)arg + 0x94) = *(uint *)((long)arg + 0x94) ^ uVar1;
  } while (uVar1 != 0);
  return;
}

Assistant:

void consumerThread (void* arg)
{
	TestBuffer*	buffer	= (TestBuffer*)arg;
	int			readPos	= 0;

	for (;;)
	{
		deInt32 val;

		deSemaphore_decrement(buffer->fill);

		val = buffer->buffer[readPos];
		readPos = (readPos + 1) % DE_LENGTH_OF_ARRAY(buffer->buffer);

		deSemaphore_increment(buffer->empty);

		buffer->consumerHash ^= val;

		if (val == 0)
			break;
	}
}